

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# leb128.cc
# Opt level: O1

Offset wabt::WriteFixedU32Leb128At(Stream *stream,Offset offset,uint32_t value,char *desc)

{
  byte local_d;
  byte local_c;
  byte local_b;
  byte local_a;
  byte local_9;
  uint8_t data [5];
  
  local_d = (byte)value | 0x80;
  local_c = (byte)(value >> 7) | 0x80;
  local_b = (byte)(value >> 0xe) | 0x80;
  local_a = (byte)(value >> 0x15) | 0x80;
  local_9 = (byte)(value >> 0x1c);
  Stream::WriteDataAt(stream,offset,&local_d,5,desc,No);
  return 5;
}

Assistant:

Offset WriteFixedU32Leb128At(Stream* stream,
                             Offset offset,
                             uint32_t value,
                             const char* desc) {
  uint8_t data[MAX_U32_LEB128_BYTES];
  Offset length =
      WriteFixedU32Leb128Raw(data, data + MAX_U32_LEB128_BYTES, value);
  stream->WriteDataAt(offset, data, length, desc);
  return length;
}